

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmbiVector.h
# Opt level: O1

void __thiscall
Eigen::internal::AmbiVector<double,_int>::Iterator::Iterator
          (Iterator *this,AmbiVector<double,_int> *vec,RealScalar *epsilon)

{
  double dVar1;
  uint uVar2;
  Scalar_conflict *pSVar3;
  bool bVar4;
  
  this->m_vector = vec;
  dVar1 = *epsilon;
  this->m_epsilon = dVar1;
  bVar4 = vec->m_mode == 0;
  this->m_isDense = bVar4;
  if (!bVar4) {
    pSVar3 = vec->m_buffer;
    uVar2 = vec->m_llStart;
    this->m_currentEl = uVar2;
    while ((-1 < (int)uVar2 && (ABS(pSVar3[(ulong)uVar2 * 2 + 1]) <= dVar1))) {
      uVar2 = *(uint *)(pSVar3 + (ulong)uVar2 * 2);
      this->m_currentEl = uVar2;
    }
    if ((int)uVar2 < 0) {
      this->m_cachedValue = 0.0;
      this->m_cachedIndex = -1;
    }
    else {
      this->m_cachedIndex = *(Index *)((long)pSVar3 + (ulong)uVar2 * 0x10 + 4);
      this->m_cachedValue = pSVar3[(ulong)uVar2 * 2 + 1];
    }
    return;
  }
  this->m_currentEl = 0;
  this->m_cachedValue = 0.0;
  this->m_cachedIndex = vec->m_start + -1;
  operator++(this);
  return;
}

Assistant:

Iterator(const AmbiVector& vec, const RealScalar& epsilon = 0)
      : m_vector(vec)
    {
      using std::abs;
      m_epsilon = epsilon;
      m_isDense = m_vector.m_mode==IsDense;
      if (m_isDense)
      {
        m_currentEl = 0;   // this is to avoid a compilation warning
        m_cachedValue = 0; // this is to avoid a compilation warning
        m_cachedIndex = m_vector.m_start-1;
        ++(*this);
      }
      else
      {
        ListEl* EIGEN_RESTRICT llElements = reinterpret_cast<ListEl*>(m_vector.m_buffer);
        m_currentEl = m_vector.m_llStart;
        while (m_currentEl>=0 && abs(llElements[m_currentEl].value)<=m_epsilon)
          m_currentEl = llElements[m_currentEl].next;
        if (m_currentEl<0)
        {
          m_cachedValue = 0; // this is to avoid a compilation warning
          m_cachedIndex = -1;
        }
        else
        {
          m_cachedIndex = llElements[m_currentEl].index;
          m_cachedValue = llElements[m_currentEl].value;
        }
      }
    }